

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::ssc::SscWriterGeneric::EndStepConsequentFixed(SscWriterGeneric *this)

{
  pointer *pppoVar1;
  iterator __position;
  _Hash_node_base *p_Var2;
  
  p_Var2 = (this->m_AllSendingReaderRanks)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      __position._M_current =
           (this->m_MpiRequests).
           super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_MpiRequests).
          super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::_M_realloc_insert<>
                  (&this->m_MpiRequests,__position);
      }
      else {
        *__position._M_current = (ompi_request_t *)0x0;
        pppoVar1 = &(this->m_MpiRequests).
                    super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppoVar1 = *pppoVar1 + 1;
      }
      MPI_Isend((this->super_SscWriterBase).m_Buffer.m_Buffer,
                (int)(this->super_SscWriterBase).m_Buffer.m_Size,&ompi_mpi_char,
                *(undefined4 *)&p_Var2[1]._M_nxt,0,(this->super_SscWriterBase).m_StreamComm,
                (this->m_MpiRequests).
                super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                super__Vector_impl_data._M_finish + -1);
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void SscWriterGeneric::EndStepConsequentFixed()
{
    for (const auto &i : m_AllSendingReaderRanks)
    {
        m_MpiRequests.emplace_back();
        MPI_Isend(m_Buffer.data(), static_cast<int>(m_Buffer.size()), MPI_CHAR, i.first, 0,
                  m_StreamComm, &m_MpiRequests.back());
    }
}